

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmViewTraceImage::Read(ON_3dmViewTraceImage *this,ON_BinaryArchive *file)

{
  wchar_t *full_path;
  ON_wString local_30;
  ON_wString bitmap_filename;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_3dmViewTraceImage *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  bitmap_filename.m_s._7_1_ =
       ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&local_20);
  if (((bool)bitmap_filename.m_s._7_1_) && (iStack_1c == 1)) {
    ON_wString::ON_wString(&local_30);
    if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
      bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadString(_minor_version,&local_30);
    }
    if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
      full_path = ON_wString::operator_cast_to_wchar_t_(&local_30);
      ON_FileReference::SetFullPath(&this->m_image_file_reference,full_path,false);
    }
    if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
      bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_width);
    }
    if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
      bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_height);
    }
    if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
      bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadPlane(_minor_version,&this->m_plane);
    }
    if (0 < local_20) {
      if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
        bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bGrayScale);
      }
      if (1 < local_20) {
        if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
          bitmap_filename.m_s._7_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bHidden);
        }
        if (2 < local_20) {
          if ((bitmap_filename.m_s._7_1_ & 1) != 0) {
            bitmap_filename.m_s._7_1_ =
                 ON_BinaryArchive::ReadBool(_minor_version,&this->m_bFiltered);
          }
          if (((bitmap_filename.m_s._7_1_ & 1) != 0) && (3 < local_20)) {
            bitmap_filename.m_s._7_1_ =
                 ON_FileReference::Read(&this->m_image_file_reference,_minor_version);
          }
        }
      }
    }
    ON_wString::~ON_wString(&local_30);
  }
  else {
    bitmap_filename.m_s._7_1_ = 0;
  }
  return (bool)(bitmap_filename.m_s._7_1_ & 1);
}

Assistant:

bool ON_3dmViewTraceImage::Read( ON_BinaryArchive& file )
{
  // opennurbs version  < 200307300 - version 1.0 or 1.1 chunk
  // opennurbs version >= 200307300 - version 1.2 chunk
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1)
  {
    ON_wString bitmap_filename;
    if (rc) rc = file.ReadString( bitmap_filename );
    if (rc)
      m_image_file_reference.SetFullPath(bitmap_filename, false);
    if (rc) rc = file.ReadDouble( &m_width );
    if (rc) rc = file.ReadDouble( &m_height );
    if (rc) rc = file.ReadPlane( m_plane );
    if ( minor_version >= 1 )
    {
      if (rc) rc = file.ReadBool(&m_bGrayScale);
      
      if ( minor_version >= 2 )
      {
        if (rc) rc = file.ReadBool(&m_bHidden);
        
        if ( minor_version >= 3 )
        {
          if (rc) rc = file.ReadBool( &m_bFiltered );

          if (rc && minor_version >= 4)
          {
            rc = m_image_file_reference.Read(file);
          }
        }
      }
    }
  }
  else
    rc = false;
  return rc;
}